

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.hpp
# Opt level: O0

anon_class_24_3_b5c2bc7a * __thiscall
tf::
make_sort_task<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
          (anon_class_24_3_b5c2bc7a *__return_storage_ptr__,tf *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b)

{
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  e_local;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  b_local;
  
  (__return_storage_ptr__->b)._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  (__return_storage_ptr__->e)._M_current = b;
  return __return_storage_ptr__;
}

Assistant:

auto make_sort_task(B b, E e, C cmp) {
  
  return [b, e, cmp] (Runtime& rt) mutable {

    using B_t = std::decay_t<unwrap_ref_decay_t<B>>;
    using E_t = std::decay_t<unwrap_ref_decay_t<E>>;

    // fetch the iterator values
    B_t beg = b;
    E_t end = e;

    if(beg == end) {
      return;
    }

    size_t W = rt.executor().num_workers();
    size_t N = std::distance(beg, end);

    // only myself - no need to spawn another graph
    if(W <= 1 || N <= detail::parallel_sort_cutoff<B_t>()) {
      std::sort(beg, end, cmp);
      return;
    }

    PreemptionGuard preemption_guard(rt);

    //detail::parallel_3wqsort(rt, beg, end-1, cmp);
    detail::parallel_pdqsort<B_t, C,
      is_std_compare_v<std::decay_t<C>> &&
      std::is_arithmetic_v<typename std::iterator_traits<B_t>::value_type>
    >(rt, beg, end, cmp, log2(size_t(end - beg)));
  };
}